

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

int Mio_DelayCompare(Mio_Gate_t **ppG1,Mio_Gate_t **ppG2)

{
  int iVar1;
  float Eps;
  int Comp;
  Mio_Gate_t **ppG2_local;
  Mio_Gate_t **ppG1_local;
  
  if ((*ppG2)->dDelayMax - 0.009463599883019924 <= (*ppG1)->dDelayMax) {
    if ((*ppG1)->dDelayMax <= (*ppG2)->dDelayMax + 0.009463599883019924) {
      iVar1 = strcmp((*ppG1)->pName,(*ppG2)->pName);
      if (iVar1 < 0) {
        ppG1_local._4_4_ = -1;
      }
      else {
        if (iVar1 < 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                        ,0x197,"int Mio_DelayCompare(Mio_Gate_t **, Mio_Gate_t **)");
        }
        ppG1_local._4_4_ = 1;
      }
    }
    else {
      ppG1_local._4_4_ = 1;
    }
  }
  else {
    ppG1_local._4_4_ = -1;
  }
  return ppG1_local._4_4_;
}

Assistant:

int Mio_DelayCompare( Mio_Gate_t ** ppG1, Mio_Gate_t ** ppG2 )
{
    int Comp;
    float Eps = (float)0.0094636;
    if ( (*ppG1)->dDelayMax < (*ppG2)->dDelayMax - Eps )
        return -1;
    if ( (*ppG1)->dDelayMax > (*ppG2)->dDelayMax + Eps )
        return 1;
    // compare names
    Comp = strcmp( (*ppG1)->pName, (*ppG2)->pName );
    if ( Comp < 0 )
        return -1;
    if ( Comp > 0 )
        return 1;
    assert( 0 );
    return 0;
}